

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::Reset
          (DeadReckoningCalculator *this,Vector *LinearVelocity,Vector *LinearAcceleration,
          Vector *AngularVelocity,WorldCoordinates *Position,EulerAngles *Orientation,
          Vector *QuatAxis,DeadReckoningAlgorithm DRA)

{
  KFLOAT32 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  Vector local_68;
  Vector local_50;
  EulerAngles *local_38;
  EulerAngles *Orientation_local;
  WorldCoordinates *Position_local;
  Vector *AngularVelocity_local;
  Vector *LinearAcceleration_local;
  Vector *LinearVelocity_local;
  DeadReckoningCalculator *this_local;
  
  this->m_DRA = DRA;
  local_38 = Orientation;
  Orientation_local = (EulerAngles *)Position;
  Position_local = (WorldCoordinates *)AngularVelocity;
  AngularVelocity_local = LinearAcceleration;
  LinearAcceleration_local = LinearVelocity;
  LinearVelocity_local = (Vector *)this;
  positionReset(this,Position);
  KVar1 = DATA_TYPE::Vector::GetX(QuatAxis);
  KVar2 = DATA_TYPE::Vector::GetY(QuatAxis);
  KVar3 = DATA_TYPE::Vector::GetZ(QuatAxis);
  if ((float)KVar1 + (float)KVar2 + (float)KVar3 <= 0.0) {
    this->m_bQuaxAxisSet = false;
  }
  else {
    quatAxisReset(this,QuatAxis);
  }
  orientationReset(this,local_38);
  angularVelocityReset(this,(Vector *)Position_local);
  velocityReset(this,LinearAcceleration_local);
  accelerationReset(this,AngularVelocity_local);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
            (&local_68,&this->m_SkewOmegaMatrix,&this->m_initLinearVelocity);
  DATA_TYPE::Vector::operator+(&local_50,&this->m_initLinearAcceleration,&local_68);
  DATA_TYPE::Vector::operator=(&this->m_Ab,&local_50);
  DATA_TYPE::Vector::~Vector(&local_50);
  DATA_TYPE::Vector::~Vector(&local_68);
  return;
}

Assistant:

void DeadReckoningCalculator::Reset( const Vector & LinearVelocity, const Vector & LinearAcceleration, const Vector & AngularVelocity,
                                     const WorldCoordinates & Position, const EulerAngles & Orientation, const Vector & QuatAxis, DeadReckoningAlgorithm DRA )
{
    m_DRA = DRA;

    positionReset( Position );
    if ((QuatAxis.GetX() + QuatAxis.GetY() + QuatAxis.GetZ()) > 0.0f) // must set m_bQuaxAxisSet before orientationReset
        quatAxisReset(QuatAxis);
    else
        m_bQuaxAxisSet = false;
    orientationReset( Orientation );
    angularVelocityReset( AngularVelocity );
    velocityReset( LinearVelocity );
    accelerationReset( LinearAcceleration );

    m_Ab = ( m_initLinearAcceleration + ( m_SkewOmegaMatrix * m_initLinearVelocity ) );
}